

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,status_type *S)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  result_type *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  delim_c *in_stack_ffffffffffffff88;
  status_type local_30;
  result_type *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  xoshiro256plus::status_type::status_type(&local_30);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff88);
  std::istream::operator>>((istream *)pbVar3,local_30.r);
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff88);
  std::istream::operator>>((istream *)pbVar3,local_30.r + 1);
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff88);
  std::istream::operator>>((istream *)pbVar3,local_30.r + 2);
  utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff88);
  std::istream::operator>>((istream *)pbVar3,local_30.r + 3);
  utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffff88);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *local_10 = local_30.r[0];
    local_10[1] = local_30.r[1];
    local_10[2] = local_30.r[2];
    local_10[3] = local_30.r[3];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.r[0] >> utility::delim(' ') >> S_new.r[1] >>
            utility::delim(' ') >> S_new.r[2] >> utility::delim(' ') >> S_new.r[3] >>
            utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }